

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O0

void __thiscall xe::BatchResult::BatchResult(BatchResult *this)

{
  BatchResult *this_local;
  
  SessionInfo::SessionInfo(&this->m_sessionInfo);
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::vector(&this->m_testCaseResults);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->m_resultMap);
  return;
}

Assistant:

BatchResult::BatchResult (void)
{
}